

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::RenderHeatmap<unsigned_long_long,ImPlot::TransformerLinLog>
               (TransformerLinLog transformer,ImDrawList *DrawList,unsigned_long_long *values,
               int rows,int cols,double scale_min,double scale_max,char *fmt,ImPlotPoint *bounds_min
               ,ImPlotPoint *bounds_max,bool reverse_y)

{
  unsigned_long_long uVar1;
  unsigned_long_long *this;
  ImU32 col_00;
  ImPlotScale IVar2;
  double dVar3;
  double v;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double local_220;
  ImVec2 local_20c;
  ImVec2 local_204;
  ImU32 local_1fc;
  undefined1 auStack_1f8 [4];
  ImU32 col_1;
  ImVec4 color;
  double t;
  ImVec2 size;
  char buff [32];
  ImVec2 local_1b0;
  ImVec2 px;
  ImPlotPoint p;
  int local_190;
  int c;
  int r;
  int i;
  ImPlotPoint half_size;
  double h;
  double w;
  RectRenderer<ImPlot::GetterHeatmap<unsigned_long_long>,_ImPlot::TransformerLogLog> local_160;
  TransformerLinLog local_144;
  RectRenderer<ImPlot::GetterHeatmap<unsigned_long_long>,_ImPlot::TransformerLinLog> local_140;
  TransformerLogLin local_124;
  RectRenderer<ImPlot::GetterHeatmap<unsigned_long_long>,_ImPlot::TransformerLogLin> local_120;
  TransformerLinLin local_104;
  RectRenderer<ImPlot::GetterHeatmap<unsigned_long_long>,_ImPlot::TransformerLinLin> local_100;
  undefined1 local_e8 [8];
  GetterHeatmap<unsigned_long_long> getter;
  double ydir;
  double yref;
  ImVec2 IStack_70;
  ImU32 col;
  ImVec2 b;
  ImVec2 a;
  unsigned_long_long temp_max;
  unsigned_long_long temp_min;
  ImPlotContext *gp;
  char *pcStack_40;
  bool reverse_y_local;
  char *fmt_local;
  double scale_max_local;
  double scale_min_local;
  int cols_local;
  int rows_local;
  unsigned_long_long *values_local;
  ImDrawList *DrawList_local;
  TransformerLinLog transformer_local;
  
  gp._7_1_ = reverse_y;
  temp_min = (unsigned_long_long)GImPlot;
  pcStack_40 = fmt;
  fmt_local = (char *)scale_max;
  scale_max_local = scale_min;
  scale_min_local._0_4_ = cols;
  scale_min_local._4_4_ = rows;
  _cols_local = values;
  values_local = (unsigned_long_long *)DrawList;
  DrawList_local._4_4_ = transformer.YAxis;
  if ((((scale_min == 0.0) && (!NAN(scale_min))) && (scale_max == 0.0)) && (!NAN(scale_max))) {
    ImMinMaxArray<unsigned_long_long>(values,rows * cols,&temp_max,(unsigned_long_long *)&a);
    auVar4._8_4_ = (int)(temp_max >> 0x20);
    auVar4._0_8_ = temp_max;
    auVar4._12_4_ = 0x45300000;
    scale_max_local =
         (auVar4._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)temp_max) - 4503599627370496.0);
    auVar5._8_4_ = a.y;
    auVar5._0_4_ = a.x;
    auVar5._4_4_ = a.y;
    auVar5._12_4_ = 0x45300000;
    fmt_local = (char *)((auVar5._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,a.x) - 4503599627370496.0));
  }
  if ((scale_max_local != (double)fmt_local) || (NAN(scale_max_local) || NAN((double)fmt_local))) {
    if ((gp._7_1_ & 1) == 0) {
      local_220 = bounds_min->y;
    }
    else {
      local_220 = bounds_max->y;
    }
    getter.HalfSize.y = (double)(int)(-(gp._7_1_ & 1) | 1);
    GetterHeatmap<unsigned_long_long>::GetterHeatmap
              ((GetterHeatmap<unsigned_long_long> *)local_e8,_cols_local,scale_min_local._4_4_,
               scale_min_local._0_4_,scale_max_local,(double)fmt_local,
               (bounds_max->x - bounds_min->x) / (double)scale_min_local._0_4_,
               (bounds_max->y - bounds_min->y) / (double)scale_min_local._4_4_,bounds_min->x,
               local_220,getter.HalfSize.y);
    IVar2 = GetCurrentScale();
    switch(IVar2) {
    case 0:
      TransformerLinLin::TransformerLinLin(&local_104);
      RectRenderer<ImPlot::GetterHeatmap<unsigned_long_long>,_ImPlot::TransformerLinLin>::
      RectRenderer(&local_100,(GetterHeatmap<unsigned_long_long> *)local_e8,&local_104);
      RenderPrimitives<ImPlot::RectRenderer<ImPlot::GetterHeatmap<unsigned_long_long>,ImPlot::TransformerLinLin>>
                (&local_100,(ImDrawList *)values_local,
                 (ImRect *)(*(long *)(temp_min + 0x28) + 0x2c8));
      break;
    case 1:
      TransformerLogLin::TransformerLogLin(&local_124);
      RectRenderer<ImPlot::GetterHeatmap<unsigned_long_long>,_ImPlot::TransformerLogLin>::
      RectRenderer(&local_120,(GetterHeatmap<unsigned_long_long> *)local_e8,&local_124);
      RenderPrimitives<ImPlot::RectRenderer<ImPlot::GetterHeatmap<unsigned_long_long>,ImPlot::TransformerLogLin>>
                (&local_120,(ImDrawList *)values_local,
                 (ImRect *)(*(long *)(temp_min + 0x28) + 0x2c8));
      break;
    case 2:
      TransformerLinLog::TransformerLinLog(&local_144);
      RectRenderer<ImPlot::GetterHeatmap<unsigned_long_long>,_ImPlot::TransformerLinLog>::
      RectRenderer(&local_140,(GetterHeatmap<unsigned_long_long> *)local_e8,&local_144);
      RenderPrimitives<ImPlot::RectRenderer<ImPlot::GetterHeatmap<unsigned_long_long>,ImPlot::TransformerLinLog>>
                (&local_140,(ImDrawList *)values_local,
                 (ImRect *)(*(long *)(temp_min + 0x28) + 0x2c8));
      break;
    case 3:
      TransformerLogLog::TransformerLogLog((TransformerLogLog *)((long)&w + 4));
      RectRenderer<ImPlot::GetterHeatmap<unsigned_long_long>,_ImPlot::TransformerLogLog>::
      RectRenderer(&local_160,(GetterHeatmap<unsigned_long_long> *)local_e8,
                   (TransformerLogLog *)((long)&w + 4));
      RenderPrimitives<ImPlot::RectRenderer<ImPlot::GetterHeatmap<unsigned_long_long>,ImPlot::TransformerLogLog>>
                (&local_160,(ImDrawList *)values_local,
                 (ImRect *)(*(long *)(temp_min + 0x28) + 0x2c8));
    }
    if (pcStack_40 != (char *)0x0) {
      dVar3 = (bounds_max->x - bounds_min->x) / (double)scale_min_local._0_4_;
      half_size.y = (bounds_max->y - bounds_min->y) / (double)scale_min_local._4_4_;
      ImPlotPoint::ImPlotPoint((ImPlotPoint *)&r,dVar3 * 0.5,half_size.y * 0.5);
      c = 0;
      for (local_190 = 0; local_190 < scale_min_local._4_4_; local_190 = local_190 + 1) {
        for (p.y._4_4_ = 0; p.y._4_4_ < scale_min_local._0_4_; p.y._4_4_ = p.y._4_4_ + 1) {
          ImPlotPoint::ImPlotPoint((ImPlotPoint *)&px);
          px = (ImVec2)((double)p.y._4_4_ * dVar3 + dVar3 * 0.5 + bounds_min->x);
          local_1b0 = TransformerLinLog::operator()
                                ((TransformerLinLog *)((long)&DrawList_local + 4),(ImPlotPoint *)&px
                                );
          sprintf((char *)&size,pcStack_40,_cols_local[c]);
          t = (double)ImGui::CalcTextSize((char *)&size,(char *)0x0,false,-1.0);
          uVar1 = _cols_local[c];
          auVar6._8_4_ = (int)(uVar1 >> 0x20);
          auVar6._0_8_ = uVar1;
          auVar6._12_4_ = 0x45300000;
          v = ImRemap01<double>((auVar6._8_8_ - 1.9342813113834067e+25) +
                                ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0),
                                scale_max_local,(double)fmt_local);
          color._8_8_ = ImClamp<double>(v,0.0,1.0);
          _auStack_1f8 = SampleColormap((float)(double)color._8_8_,-1);
          local_1fc = CalcTextColor((ImVec4 *)auStack_1f8);
          this = values_local;
          local_20c = ::operator*((ImVec2 *)&t,0.5);
          local_204 = operator-(&local_1b0,&local_20c);
          ImDrawList::AddText((ImDrawList *)this,&local_204,local_1fc,(char *)&size,(char *)0x0);
          c = c + 1;
        }
      }
    }
  }
  else {
    b = TransformerLinLog::operator()((TransformerLinLog *)((long)&DrawList_local + 4),bounds_min);
    IStack_70 = TransformerLinLog::operator()
                          ((TransformerLinLog *)((long)&DrawList_local + 4),bounds_max);
    col_00 = GetColormapColorU32(0,*(ImPlotColormap *)(temp_min + 0x488));
    ImDrawList::AddRectFilled((ImDrawList *)values_local,&b,&stack0xffffffffffffff90,col_00,0.0,0);
  }
  return;
}

Assistant:

void RenderHeatmap(Transformer transformer, ImDrawList& DrawList, const T* values, int rows, int cols, double scale_min, double scale_max, const char* fmt, const ImPlotPoint& bounds_min, const ImPlotPoint& bounds_max, bool reverse_y) {
    ImPlotContext& gp = *GImPlot;
    if (scale_min == 0 && scale_max == 0) {
        T temp_min, temp_max;
        ImMinMaxArray(values,rows*cols,&temp_min,&temp_max);
        scale_min = (double)temp_min;
        scale_max = (double)temp_max;
    }
    if (scale_min == scale_max) {
        ImVec2 a = transformer(bounds_min);
        ImVec2 b = transformer(bounds_max);
        ImU32  col = GetColormapColorU32(0,gp.Style.Colormap);
        DrawList.AddRectFilled(a, b, col);
        return;
    }
    const double yref = reverse_y ? bounds_max.y : bounds_min.y;
    const double ydir = reverse_y ? -1 : 1;
    GetterHeatmap<T> getter(values, rows, cols, scale_min, scale_max, (bounds_max.x - bounds_min.x) / cols, (bounds_max.y - bounds_min.y) / rows, bounds_min.x, yref, ydir);
    switch (GetCurrentScale()) {
        case ImPlotScale_LinLin: RenderPrimitives(RectRenderer<GetterHeatmap<T>, TransformerLinLin>(getter, TransformerLinLin()), DrawList, gp.CurrentPlot->PlotRect); break;
        case ImPlotScale_LogLin: RenderPrimitives(RectRenderer<GetterHeatmap<T>, TransformerLogLin>(getter, TransformerLogLin()), DrawList, gp.CurrentPlot->PlotRect); break;;
        case ImPlotScale_LinLog: RenderPrimitives(RectRenderer<GetterHeatmap<T>, TransformerLinLog>(getter, TransformerLinLog()), DrawList, gp.CurrentPlot->PlotRect); break;;
        case ImPlotScale_LogLog: RenderPrimitives(RectRenderer<GetterHeatmap<T>, TransformerLogLog>(getter, TransformerLogLog()), DrawList, gp.CurrentPlot->PlotRect); break;;
    }
    if (fmt != NULL) {
        const double w = (bounds_max.x - bounds_min.x) / cols;
        const double h = (bounds_max.y - bounds_min.y) / rows;
        const ImPlotPoint half_size(w*0.5,h*0.5);
        int i = 0;
        for (int r = 0; r < rows; ++r) {
            for (int c = 0; c < cols; ++c) {
                ImPlotPoint p;
                p.x = bounds_min.x + 0.5*w + c*w;
                p.y = yref + ydir * (0.5*h + r*h);
                ImVec2 px = transformer(p);
                char buff[32];
                sprintf(buff, fmt, values[i]);
                ImVec2 size = ImGui::CalcTextSize(buff);
                double t = ImClamp(ImRemap01((double)values[i], scale_min, scale_max),0.0,1.0);
                ImVec4 color = SampleColormap((float)t);
                ImU32 col = CalcTextColor(color);
                DrawList.AddText(px - size * 0.5f, col, buff);
                i++;
            }
        }
    }
}